

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filon.cpp
# Opt level: O3

double filon_fun_cos(int n,_func_double_ptr_int_double_ptr *f,double a,double b,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  ulong uVar9;
  double *pdVar10;
  ostream *poVar11;
  uint uVar12;
  ulong uVar13;
  char *pcVar14;
  long lVar15;
  uint uVar16;
  double dVar17;
  double local_78;
  double local_70;
  double local_48;
  double local_38;
  
  if ((a == b) && (!NAN(a) && !NAN(b))) {
    return 0.0;
  }
  if (n < 2) {
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
    pcVar14 = "  N < 2\n";
  }
  else {
    if ((n & 1U) != 0) {
      pdVar8 = (double *)operator_new__((ulong)(uint)n * 8);
      uVar16 = n - 1;
      uVar9 = 0;
      uVar12 = uVar16;
      do {
        pdVar8[uVar9] = ((double)(int)uVar12 * a + (double)(int)uVar9 * b) / (double)(int)uVar16;
        uVar9 = uVar9 + 1;
        uVar12 = uVar12 - 1;
      } while ((uint)n != uVar9);
      dVar17 = (b - a) / (double)(int)uVar16;
      dVar2 = dVar17 * t;
      dVar3 = sin(dVar2);
      dVar4 = cos(dVar2);
      if (ABS(dVar2) * 6.0 <= 1.0) {
        dVar3 = pow(dVar2,3.0);
        dVar4 = pow(dVar2,5.0);
        dVar1 = pow(dVar2,7.0);
        local_78 = (dVar1 + dVar1) / 4725.0 + (dVar4 + dVar4) / -315.0 + (dVar3 + dVar3) / 45.0;
        dVar5 = (dVar2 * dVar2 + dVar2 * dVar2) / 15.0;
        dVar3 = pow(dVar2,4.0);
        dVar4 = pow(dVar2,6.0);
        dVar1 = pow(dVar2,8.0);
        local_70 = (dVar1 * 4.0) / -22275.0 +
                   (dVar4 + dVar4) / 567.0 + (dVar3 * 4.0) / -105.0 + dVar5 + 0.6666666666666666;
        dVar3 = pow(dVar2,4.0);
        dVar2 = pow(dVar2,6.0);
        local_38 = dVar2 / -11340.0 + dVar3 / 210.0 + (1.3333333333333333 - dVar5);
      }
      else {
        local_78 = pow(dVar2,3.0);
        local_78 = (dVar3 * -2.0 * dVar3 + dVar2 * dVar3 * dVar4 + dVar2 * dVar2) / local_78;
        local_70 = pow(dVar2,3.0);
        local_70 = (dVar3 * -4.0 * dVar4 + (dVar2 + dVar2) * dVar4 * dVar4 + dVar2 + dVar2) /
                   local_70;
        local_38 = pow(dVar2,3.0);
        local_38 = ((dVar3 - dVar4 * dVar2) * 4.0) / local_38;
      }
      pdVar10 = (*f)(n,pdVar8);
      dVar2 = *pdVar10;
      local_48 = cos(*pdVar8 * t);
      local_48 = local_48 * dVar2 * 0.5;
      uVar9 = (ulong)uVar16;
      if (3 < n) {
        uVar13 = 2;
        do {
          dVar2 = pdVar10[uVar13];
          dVar3 = cos(pdVar8[uVar13] * t);
          local_48 = local_48 + dVar3 * dVar2;
          uVar13 = uVar13 + 2;
        } while (uVar13 < uVar9);
      }
      dVar2 = pdVar10[uVar9];
      dVar3 = cos(pdVar8[uVar9] * t);
      dVar4 = 0.0;
      if (n != 2) {
        lVar15 = 1;
        dVar4 = 0.0;
        do {
          dVar1 = pdVar10[lVar15];
          dVar5 = cos(pdVar8[lVar15] * t);
          dVar4 = dVar4 + dVar5 * dVar1;
          lVar15 = lVar15 + 2;
        } while (lVar15 <= n + -2);
      }
      dVar1 = pdVar10[uVar9];
      dVar6 = sin(pdVar8[uVar9] * t);
      dVar5 = *pdVar10;
      dVar7 = sin(t * *pdVar8);
      operator_delete__(pdVar10);
      operator_delete__(pdVar8);
      return dVar17 * (local_70 * (dVar3 * dVar2 * 0.5 + local_48) +
                       local_78 * (dVar6 * dVar1 - dVar7 * dVar5) + local_38 * dVar4);
    }
    std::operator<<((ostream *)&std::cerr,"\n");
    std::operator<<((ostream *)&std::cerr,"FILON_FUN_COS - Fatal error!\n");
    pcVar14 = "  N must be odd.\n";
  }
  std::operator<<((ostream *)&std::cerr,pcVar14);
  poVar11 = std::operator<<((ostream *)&std::cerr,"  N = ");
  poVar11 = (ostream *)std::ostream::operator<<(poVar11,n);
  std::operator<<(poVar11,"\n");
  exit(1);
}

Assistant:

double filon_fun_cos ( int n, double *f ( int n, double x[] ), double a, 
  double b, double t )

//****************************************************************************80
//
//  Purpose:
//
//    FILON_FUN_COS uses Filon's method on integrals with a cosine factor.
//
//  Discussion:
//
//    The integral to be approximated has the form:
//
//      Integral ( A <= X <= B ) F(X) * COS(T*X) dX
//
//    where T is user specified.
//
//    The function is interpolated over each subinterval by
//    a parabolic arc.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 May 2014
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Milton Abramowitz, Irene Stegun,
//    Handbook of Mathematical Functions,
//    National Bureau of Standards, 1964,
//    ISBN: 0-486-61272-4,
//    LC: QA47.A34.
//
//    Stephen Chase, Lloyd Fosdick,
//    An Algorithm for Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 453-457.
//
//    Stephen Chase, Lloyd Fosdick,
//    Algorithm 353:
//    Filon Quadrature,
//    Communications of the Association for Computing Machinery,
//    Volume 12, Number 8, August 1969, pages 457-458.
//
//    Philip Davis, Philip Rabinowitz,
//    Methods of Numerical Integration,
//    Second Edition,
//    Dover, 2007,
//    ISBN: 0486453391,
//    LC: QA299.3.D28.
//
//  Parameters:
//
//    Input, int N, the number of data points.
//    N must be odd, and greater than 1.
//
//    Input, double *F ( int n, double x[] ), the function which evaluates the 
//    integrand.
//
//    Input, double A, B, the limits of integration.
//
//    Input, double T, the multiplier of the X argument of the cosine.
//
//    Output, double FILON_FUN_COS, the approximate value of the integral.
//
{
  double alpha;
  double beta;
  double c2n;
  double c2nm1;
  double cost;
  double *ftab;
  double gamma;
  double h;
  int i;
  double sint;
  double theta;
  double value;
  double *x;

  if ( a == b )
  {
    value = 0.0;
    return value;
  }
 
  if ( n <= 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N < 2\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
 
  if ( ( n % 2 ) != 1 )
  {
    cerr << "\n";
    cerr << "FILON_FUN_COS - Fatal error!\n";
    cerr << "  N must be odd.\n";
    cerr << "  N = " << n << "\n";
    exit ( 1 );
  }
//
//  Set the X values.
//
  x = new double[n];
  for ( i = 0; i < n; i++ )
  {
    x[i] = ( static_cast<double> ( n - i - 1 ) * a   
           + static_cast<double> (     i     ) * b ) 
           / static_cast<double> ( n     - 1 );
  }

  h = ( b - a ) / static_cast<double> ( n - 1 );
  theta = t * h;
  sint = sin ( theta );
  cost = cos ( theta );

  if ( 6.0 * fabs ( theta ) <= 1.0 )
  {
    alpha = 2.0 * pow ( theta, 3 ) /   45.0 
          - 2.0 * pow ( theta, 5 ) /  315.0 
          + 2.0 * pow ( theta, 7 ) / 4725.0;
  
    beta =  2.0                    /     3.0 
          + 2.0 * pow ( theta, 2 ) /    15.0 
          - 4.0 * pow ( theta, 4 ) /   105.0 
          + 2.0 * pow ( theta, 6 ) /   567.0 
          - 4.0 * pow ( theta, 8 ) / 22275.0;

    gamma = 4.0                    /      3.0 
          - 2.0 * pow ( theta, 2 ) /     15.0 
          +       pow ( theta, 4 ) /    210.0 
          -       pow ( theta, 6 ) /  11340.0;
  }
  else
  {
    alpha = ( pow ( theta, 2 ) + theta * sint * cost - 2.0 * sint * sint ) 
      / pow ( theta, 3 );

    beta = ( 2.0 * theta + 2.0 * theta * cost * cost
      - 4.0 * sint * cost ) / pow ( theta, 3 );

    gamma = 4.0 * ( sint - theta * cost ) / pow ( theta, 3 );
  }
//
//  Tabulate the function.
//
  ftab = f ( n, x );

  c2n = 0.5 * ftab[0] * cos ( t * x[0] );
  for ( i = 2; i < n - 1; i = i + 2 )
  {
    c2n = c2n + ftab[i] * cos ( t * x[i] );
  }
  c2n = c2n + 0.5 * ftab[n-1] * cos ( t * x[n-1] );

  c2nm1 = 0.0;
  for ( i = 1; i <= n - 2; i = i + 2 )
  {
    c2nm1 = c2nm1 + ftab[i] * cos ( t * x[i] );
  }

  value = h * ( 
      alpha * ( ftab[n-1] * sin ( t * x[n-1] )  
              - ftab[0]   * sin ( t * x[0] ) ) 
    + beta * c2n 
    + gamma * c2nm1 );

  delete [] ftab;
  delete [] x;

  return value;
}